

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

void __thiscall Parser::unexpected(Parser *this)

{
  unsigned_long *puVar1;
  TokenType TVar2;
  pointer pcVar3;
  long *plVar4;
  size_t sVar5;
  ostream *poVar6;
  runtime_error *this_00;
  stringstream msg;
  undefined4 uStack_25c;
  long *local_258 [2];
  long local_248 [2];
  unsigned_long local_238;
  unsigned_long uStack_230;
  TokenType local_228;
  long *local_220 [2];
  long local_210 [2];
  unsigned_long local_200;
  unsigned_long uStack_1f8;
  TokenType local_1f0;
  long *local_1e8 [2];
  long local_1d8 [2];
  unsigned_long local_1c8;
  unsigned_long uStack_1c0;
  stringstream local_1b8 [16];
  long local_1a8 [47];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Unexpected \'",0xc);
  TVar2 = (this->currentToken).type;
  pcVar3 = (this->currentToken).lexeme._M_dataplus._M_p;
  local_258[0] = local_248;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_258,pcVar3,pcVar3 + (this->currentToken).lexeme._M_string_length);
  plVar4 = local_258[0];
  local_238 = (this->currentToken).line;
  uStack_230 = (this->currentToken).col;
  if (local_258[0] == (long *)0x0) {
    std::ios::clear((int)(ostream *)local_1a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
  }
  else {
    sVar5 = strlen((char *)local_258[0]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)plVar4,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\' on line ",10);
  local_1f0 = (this->currentToken).type;
  pcVar3 = (this->currentToken).lexeme._M_dataplus._M_p;
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1e8,pcVar3,pcVar3 + (this->currentToken).lexeme._M_string_length);
  puVar1 = &(this->currentToken).line;
  local_1c8 = *puVar1;
  uStack_1c0 = (this->currentToken).col;
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," column ",8);
  local_228 = (this->currentToken).type;
  pcVar3 = (this->currentToken).lexeme._M_dataplus._M_p;
  local_220[0] = local_210;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_220,pcVar3,pcVar3 + (this->currentToken).lexeme._M_string_length);
  local_200 = *puVar1;
  uStack_1f8 = (this->currentToken).col;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  if (local_220[0] != local_210) {
    operator_delete(local_220[0],local_210[0] + 1);
  }
  if (local_1e8[0] != local_1d8) {
    operator_delete(local_1e8[0],local_1d8[0] + 1);
  }
  if (local_258[0] != local_248) {
    operator_delete(local_258[0],local_248[0] + 1);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,(char *)CONCAT44(uStack_25c,TVar2));
  *(undefined ***)this_00 = &PTR__runtime_error_0012e7f8;
  __cxa_throw(this_00,&ParseException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Parser::unexpected() {
    std::stringstream msg;
    msg << "Unexpected '" << token().lexeme.c_str() << "' on line " << token().line << " column " << token().col;
    throw ParseException(msg.str().c_str());
}